

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O0

int ddDoDumpBlif(DdManager *dd,DdNode *f,FILE *fp,st__table *visited,char **names,int mv)

{
  DdNode *f_00;
  int iVar1;
  DdNode *f_01;
  char *pcVar2;
  int local_54;
  int retval;
  DdNode *E;
  DdNode *T;
  int mv_local;
  char **names_local;
  st__table *visited_local;
  FILE *fp_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  iVar1 = st__lookup(visited,(char *)f,(char **)0x0);
  if (iVar1 == 1) {
    dd_local._4_4_ = 1;
  }
  else if (f == (DdNode *)0x0) {
    dd_local._4_4_ = 0;
  }
  else {
    iVar1 = st__insert(visited,(char *)f,(char *)0x0);
    if (iVar1 == -10000) {
      dd_local._4_4_ = 0;
    }
    else if (f == dd->one) {
      iVar1 = fprintf((FILE *)fp,".names %lx\n1\n",(ulong)f / 0x28);
      if (iVar1 == -1) {
        dd_local._4_4_ = 0;
      }
      else {
        dd_local._4_4_ = 1;
      }
    }
    else if (f == dd->zero) {
      pcVar2 = "";
      if (mv != 0) {
        pcVar2 = "0\n";
      }
      iVar1 = fprintf((FILE *)fp,".names %lx\n%s",(ulong)f / 0x28,pcVar2);
      if (iVar1 == -1) {
        dd_local._4_4_ = 0;
      }
      else {
        dd_local._4_4_ = 1;
      }
    }
    else if (f->index == 0x7fffffff) {
      dd_local._4_4_ = 0;
    }
    else {
      f_00 = (f->type).kids.T;
      dd_local._4_4_ = ddDoDumpBlif(dd,f_00,fp,visited,names,mv);
      if (dd_local._4_4_ == 1) {
        f_01 = (DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe);
        dd_local._4_4_ = ddDoDumpBlif(dd,f_01,fp,visited,names,mv);
        if (dd_local._4_4_ == 1) {
          if (names == (char **)0x0) {
            local_54 = fprintf((FILE *)fp,".names %u",(ulong)f->index);
          }
          else {
            local_54 = fprintf((FILE *)fp,".names %s",names[f->index]);
          }
          if (local_54 == -1) {
            dd_local._4_4_ = 0;
          }
          else {
            if (mv == 0) {
              if (((ulong)(f->type).kids.E & 1) == 0) {
                local_54 = fprintf((FILE *)fp," %lx %lx %lx\n11- 1\n0-1 1\n",(ulong)f_00 / 0x28,
                                   (ulong)f_01 / 0x28,(ulong)f / 0x28);
              }
              else {
                local_54 = fprintf((FILE *)fp," %lx %lx %lx\n11- 1\n0-0 1\n",(ulong)f_00 / 0x28,
                                   (ulong)f_01 / 0x28,(ulong)f / 0x28);
              }
            }
            else if (((ulong)(f->type).kids.E & 1) == 0) {
              local_54 = fprintf((FILE *)fp," %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 1 1\n",
                                 (ulong)f_00 / 0x28,(ulong)f_01 / 0x28,(ulong)f / 0x28);
            }
            else {
              local_54 = fprintf((FILE *)fp," %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 0 1\n",
                                 (ulong)f_00 / 0x28,(ulong)f_01 / 0x28,(ulong)f / 0x28);
            }
            if (local_54 == -1) {
              dd_local._4_4_ = 0;
            }
            else {
              dd_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

static int
ddDoDumpBlif(
  DdManager * dd,
  DdNode * f,
  FILE * fp,
  st__table * visited,
  char ** names,
  int mv)
{
    DdNode      *T, *E;
    int         retval;

#ifdef DD_DEBUG
    assert(!Cudd_IsComplement(f));
#endif

    /* If already visited, nothing to do. */
    if ( st__is_member(visited, (char *) f) == 1)
        return(1);

    /* Check for abnormal condition that should never happen. */
    if (f == NULL)
        return(0);

    /* Mark node as visited. */
    if ( st__insert(visited, (char *) f, NULL) == st__OUT_OF_MEM)
        return(0);

    /* Check for special case: If constant node, generate constant 1. */
    if (f == DD_ONE(dd)) {
#if SIZEOF_VOID_P == 8
        retval = fprintf(fp, ".names %lx\n1\n",(ptruint) f / (ptruint) sizeof(DdNode));
#else
        retval = fprintf(fp, ".names %x\n1\n",(ptruint) f / (ptruint) sizeof(DdNode));
#endif
        if (retval == EOF) {
            return(0);
        } else {
            return(1);
        }
    }

    /* Check whether this is an ADD. We deal with 0-1 ADDs, but not
    ** with the general case.
    */
    if (f == DD_ZERO(dd)) {
#if SIZEOF_VOID_P == 8
        retval = fprintf(fp, ".names %lx\n%s",
                         (ptruint) f / (ptruint) sizeof(DdNode),
                         mv ? "0\n" : "");
#else
        retval = fprintf(fp, ".names %x\n%s",
                         (ptruint) f / (ptruint) sizeof(DdNode),
                         mv ? "0\n" : "");
#endif
        if (retval == EOF) {
            return(0);
        } else {
            return(1);
        }
    }
    if (cuddIsConstant(f))
        return(0);

    /* Recursive calls. */
    T = cuddT(f);
    retval = ddDoDumpBlif(dd,T,fp,visited,names,mv);
    if (retval != 1) return(retval);
    E = Cudd_Regular(cuddE(f));
    retval = ddDoDumpBlif(dd,E,fp,visited,names,mv);
    if (retval != 1) return(retval);

    /* Write multiplexer taking complement arc into account. */
    if (names != NULL) {
        retval = fprintf(fp,".names %s", names[f->index]);
    } else {
#if SIZEOF_VOID_P == 8 && SIZEOF_INT == 4
        retval = fprintf(fp,".names %u", f->index);
#else
        retval = fprintf(fp,".names %hu", f->index);
#endif
    }
    if (retval == EOF)
        return(0);

#if SIZEOF_VOID_P == 8
    if (mv) {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %lx %lx %lx\n.def 0\n1 1 - 1\n0 - 1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    } else {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %lx %lx %lx\n11- 1\n0-0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %lx %lx %lx\n11- 1\n0-1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    }
#else
    if (mv) {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %x %x %x\n.def 0\n1 1 - 1\n0 - 0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %x %x %x\n.def 0\n1 1 - 1\n0 - 1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    } else {
        if (Cudd_IsComplement(cuddE(f))) {
            retval = fprintf(fp," %x %x %x\n11- 1\n0-0 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        } else {
            retval = fprintf(fp," %x %x %x\n11- 1\n0-1 1\n",
                (ptruint) T / (ptruint) sizeof(DdNode),
                (ptruint) E / (ptruint) sizeof(DdNode),
                (ptruint) f / (ptruint) sizeof(DdNode));
        }
    }
#endif
    if (retval == EOF) {
        return(0);
    } else {
        return(1);
    }

}